

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O1

uint32_t vbyte_decode_u32(uint8_t **input)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  pbVar2 = *input;
  do {
    *input = pbVar2 + 1;
    bVar1 = *pbVar2;
    uVar3 = uVar3 + ((bVar1 & 0x7f) << (uVar4 & 0x1f));
    uVar4 = uVar4 + 7;
    pbVar2 = pbVar2 + 1;
  } while ((char)bVar1 < '\0');
  return uVar3;
}

Assistant:

uint32_t vbyte_decode_u32(const uint8_t*& input)
{
    uint32_t x = 0;
    uint32_t shift = 0;
    while (true) {
        uint8_t c = *input++;
        x += ((c & 127) << shift);
        if (!(c & 128)) {
            return x;
        }
        shift += 7;
    }
    return x;
}